

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDetector.cpp
# Opt level: O2

DimensionEstimate *
ZXing::QRCode::EstimateDimension
          (DimensionEstimate *__return_storage_ptr__,BitMatrix *image,ConcentricPattern a,
          ConcentricPattern b)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  
  dVar1 = EstimateModuleSize(image,a,b);
  dVar2 = EstimateModuleSize(image,b,a);
  dVar7 = 0.0;
  iVar3 = 0;
  iVar5 = 4;
  if ((0.0 <= dVar1) && (iVar3 = 0, 0.0 <= dVar2)) {
    dVar7 = (dVar1 + dVar2) * 0.5;
    lVar4 = lround(SQRT((a.super_PointF.x - b.super_PointF.x) *
                        (a.super_PointF.x - b.super_PointF.x) +
                        (a.super_PointF.y - b.super_PointF.y) *
                        (a.super_PointF.y - b.super_PointF.y)) / dVar7);
    iVar6 = 1 - ((int)lVar4 + 7) % 4;
    iVar3 = iVar6 + (int)lVar4 + 7;
    iVar5 = -iVar6;
    if (0 < iVar6) {
      iVar5 = iVar6;
    }
  }
  __return_storage_ptr__->dim = iVar3;
  __return_storage_ptr__->ms = dVar7;
  __return_storage_ptr__->err = iVar5;
  return __return_storage_ptr__;
}

Assistant:

static DimensionEstimate EstimateDimension(const BitMatrix& image, ConcentricPattern a, ConcentricPattern b)
{
	auto ms_a = EstimateModuleSize(image, a, b);
	auto ms_b = EstimateModuleSize(image, b, a);

	if (ms_a < 0 || ms_b < 0)
		return {};

	auto moduleSize = (ms_a + ms_b) / 2;

	int dimension = narrow_cast<int>(std::lround(distance(a, b) / moduleSize) + 7);
	int error     = 1 - (dimension % 4);

	return {dimension + error, moduleSize, std::abs(error)};
}